

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O1

int main(void)

{
  createDB();
  printDB();
  modifyDB();
  printDB();
  modifyDB();
  printDB();
  return 0;
}

Assistant:

int main()
{
  createDB();
  printDB();
  modifyDB();
  printDB();
  modifyDB();
  printDB();
  return 0;
}